

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

char * voc_read_oops(voccxdef *ctx,char *oopsbuf,size_t oopsbuflen,char *unknown_word)

{
  byte *pbVar1;
  int iVar2;
  ushort **ppuVar3;
  size_t sVar4;
  undefined8 in_RCX;
  byte *in_RSI;
  voccxdef *in_RDI;
  bool bVar5;
  char *p;
  byte local_34;
  byte *local_30;
  byte *local_8;
  
  vocerr(in_RDI,2,"I don\'t know the word \"%s\".",in_RCX);
  iVar2 = vocread((voccxdef *)oopsbuf,oopsbuflen._6_2_,oopsbuflen._4_2_,unknown_word,p._4_4_,(int)p)
  ;
  local_30 = in_RSI;
  if (iVar2 == 1) {
    local_8 = (byte *)0x0;
  }
  else {
    for (; pbVar1 = in_RSI, *local_30 != 0; local_30 = local_30 + 1) {
      if ((*local_30 < 0x80) &&
         (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(uint)*local_30] & 0x100) != 0)) {
        iVar2 = tolower((int)(char)*local_30);
        local_34 = (byte)iVar2;
      }
      else {
        local_34 = *local_30;
      }
      *local_30 = local_34;
    }
    while( true ) {
      local_30 = pbVar1;
      bVar5 = false;
      if (*local_30 < 0x80) {
        ppuVar3 = __ctype_b_loc();
        bVar5 = ((*ppuVar3)[(int)(uint)*local_30] & 0x2000) != 0;
      }
      if (!bVar5) break;
      pbVar1 = local_30 + 1;
    }
    sVar4 = strlen((char *)local_30);
    if (((sVar4 < 6) || (iVar2 = memcmp(local_30,"oops ",5), iVar2 != 0)) &&
       ((sVar4 = strlen((char *)local_30), sVar4 < 6 ||
        (iVar2 = memcmp(local_30,"oops,",5), iVar2 != 0)))) {
      sVar4 = strlen((char *)local_30);
      if (((sVar4 < 3) || (*(short *)local_30 != 0x206f)) &&
         ((sVar4 = strlen((char *)local_30), sVar4 < 3 || (*(short *)local_30 != 0x2c6f)))) {
        return (char *)0x0;
      }
      local_30 = local_30 + 2;
    }
    else {
      local_30 = local_30 + 5;
    }
    while( true ) {
      bVar5 = false;
      if (*local_30 < 0x80) {
        ppuVar3 = __ctype_b_loc();
        bVar5 = ((*ppuVar3)[(int)(uint)*local_30] & 0x2000) != 0;
      }
      if (!bVar5) break;
      local_30 = local_30 + 1;
    }
    local_8 = local_30;
  }
  return (char *)local_8;
}

Assistant:

static char *voc_read_oops(voccxdef *ctx, char *oopsbuf, size_t oopsbuflen,
                           const char *unknown_word)
{
    char *p;
    
    /* display the error */
    vocerr(ctx, VOCERR(2), "I don't know the word \"%s\".", unknown_word);

    /* read a new command */
    if (vocread(ctx, MCMONINV, MCMONINV,
                oopsbuf, (int)oopsbuflen, 1) == VOCREAD_REDO)
    {
        /* 
         *   we've already decided it's not an OOPS input - return null to
         *   indicate to the caller that we have a new command 
         */
        return 0;
    }

    /* lower-case the string */
    for (p = oopsbuf ; *p != '\0' ; ++p)
        *p = (vocisupper(*p) ? tolower(*p) : *p);

    /* skip leading spaces */
    for (p = oopsbuf ; vocisspace(*p) ; ++p) ;

    /* 
     *   See if they are saying "oops".  Allow "oops" or simply "o",
     *   followed by either a space or a comma.  
     */
    if ((strlen(p) > 5 && memcmp(p, "oops ", 5) == 0)
        || (strlen(p) > 5 && memcmp(p, "oops,", 5) == 0))
    {
        /* we found "OOPS" - move to the next character */
        p += 5;
    }
    else if ((strlen(p) > 2 && memcmp(p, "o ", 2) == 0)
             || (strlen(p) > 2 && memcmp(p, "o,", 2) == 0))
    {
        /* we found "O" - move to the next character */
        p += 2;
    }
    else
    {
        /* 
         *   we didn't find any form of "OOPS" response - return null to
         *   indicate to the caller that the player entered a new command 
         */
        return 0;
    }

    /* skip spaces before the replacement text */
    for ( ; vocisspace(*p) ; ++p) ;

    /* return a pointer to the start of the replacement text */
    return p;
}